

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::attDef
          (AbstractDOMParser *this,DTDElementDecl *elemDecl,DTDAttDef *attDef,bool param_3)

{
  short *psVar1;
  DefAttTypes DVar2;
  XMLCh *pXVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLSize_t i;
  long lVar7;
  XMLBuffer *pXVar8;
  undefined1 *puVar9;
  long lVar10;
  XMLCh XVar11;
  
  bVar4 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (!bVar4) {
    return;
  }
  iVar5 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar5 == '\0') {
    return;
  }
  pXVar8 = this->fInternalSubset;
  iVar5 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
  XMLBuffer::append(pXVar8,(XMLCh *)CONCAT44(extraout_var,iVar5));
  switch((attDef->super_XMLAttDef).fType) {
  case AttTypes_Min:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgCDATAString;
    break;
  case ID:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = (undefined1 *)0x365208;
    break;
  case IDRef:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgIDRefString;
    break;
  case IDRefs:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgIDRefsString;
    break;
  case Entity:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = (undefined1 *)0x36507e;
    break;
  case Entities:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgEntitiesString;
    break;
  case NmToken:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgNmTokenString;
    break;
  case NmTokens:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = XMLUni::fgNmTokensString;
    break;
  case Notation:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    puVar9 = (undefined1 *)0x365380;
    break;
  case Enumeration:
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar3 = (attDef->super_XMLAttDef).fEnumeration;
    lVar10 = 0;
    if (pXVar3 != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)pXVar3 + lVar10);
        lVar10 = lVar10 + 2;
      } while (*psVar1 != 0);
      lVar10 = (lVar10 >> 1) + -1;
    }
    if (lVar10 != 0) {
      XMLBuffer::append(this->fInternalSubset,L'(');
      lVar7 = 0;
      do {
        pXVar8 = this->fInternalSubset;
        XVar11 = pXVar3[lVar7];
        if (pXVar3[lVar7] == L' ') {
          XVar11 = L'|';
        }
        if (pXVar8->fIndex == pXVar8->fCapacity) {
          XMLBuffer::ensureCapacity(pXVar8,1);
        }
        XVar6 = pXVar8->fIndex;
        pXVar8->fIndex = XVar6 + 1;
        pXVar8->fBuffer[XVar6] = XVar11;
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
      XMLBuffer::append(this->fInternalSubset,L')');
    }
  default:
    goto switchD_002e0435_default;
  }
  XMLBuffer::append(pXVar8,(XMLCh *)puVar9);
switchD_002e0435_default:
  DVar2 = (attDef->super_XMLAttDef).fDefaultType;
  if (DVar2 == Fixed) {
    pXVar8 = this->fInternalSubset;
    XVar6 = pXVar8->fIndex;
    puVar9 = XMLUni::fgFixedString;
  }
  else if (DVar2 == Implied) {
    pXVar8 = this->fInternalSubset;
    XVar6 = pXVar8->fIndex;
    puVar9 = XMLUni::fgImpliedString;
  }
  else {
    if (DVar2 != Required) goto LAB_002e07f1;
    pXVar8 = this->fInternalSubset;
    XVar6 = pXVar8->fIndex;
    puVar9 = XMLUni::fgRequiredString;
  }
  if (XVar6 == pXVar8->fCapacity) {
    XMLBuffer::ensureCapacity(pXVar8,1);
  }
  XVar6 = pXVar8->fIndex;
  pXVar8->fIndex = XVar6 + 1;
  pXVar8->fBuffer[XVar6] = L' ';
  XMLBuffer::append(this->fInternalSubset,(XMLCh *)puVar9);
LAB_002e07f1:
  pXVar3 = (attDef->super_XMLAttDef).fValue;
  if (pXVar3 != (XMLCh *)0x0) {
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L'\"';
    XMLBuffer::append(this->fInternalSubset,pXVar3);
    pXVar8 = this->fInternalSubset;
    if (pXVar8->fIndex == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
    }
    XVar6 = pXVar8->fIndex;
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L'\"';
  }
  return;
}

Assistant:

void AbstractDOMParser::attDef
(
    const   DTDElementDecl&     elemDecl
    , const DTDAttDef&          attDef
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        if (elemDecl.hasAttDefs())
        {
            fInternalSubset.append(attDef.getFullName());

            // Get the type and display it
            const XMLAttDef::AttTypes type = attDef.getType();
            switch(type)
            {
            case XMLAttDef::CData :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgCDATAString);
                break;
            case XMLAttDef::ID :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDString);
                break;
            case XMLAttDef::IDRef :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefString);
                break;
            case XMLAttDef::IDRefs :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefsString);
                break;
            case XMLAttDef::Entity :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntityString);
                break;
            case XMLAttDef::Entities :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntitiesString);
                break;
            case XMLAttDef::NmToken :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokenString);
                break;
            case XMLAttDef::NmTokens :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokensString);
                break;

            case XMLAttDef::Notation :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNotationString);
                break;

            case XMLAttDef::Enumeration :
                {
                    fInternalSubset.append(chSpace);
                    const XMLCh* enumString = attDef.getEnumeration();
                    XMLSize_t length = XMLString::stringLen(enumString);
                    if (length > 0) {

                        fInternalSubset.append(chOpenParen );
                        for(XMLSize_t i=0; i<length; i++) {
                            if (enumString[i] == chSpace)
                                fInternalSubset.append(chPipe);
                            else
                                fInternalSubset.append(enumString[i]);
                        }
                        fInternalSubset.append(chCloseParen);
                    }
                }
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }
            //get te default types of the attlist
            const XMLAttDef::DefAttTypes def = attDef.getDefaultType();
            switch(def)
            {
            case XMLAttDef::Required :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgRequiredString);
                break;
            case XMLAttDef::Implied :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgImpliedString);
                break;
            case XMLAttDef::Fixed :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgFixedString);
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }

            const XMLCh* defaultValue = attDef.getValue();
            if (defaultValue != 0) {
                fInternalSubset.append(chSpace);
                fInternalSubset.append(chDoubleQuote);
                fInternalSubset.append(defaultValue);
                fInternalSubset.append(chDoubleQuote);
            }
        }
    }
}